

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaNormLen(xmlChar *value)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  
  if (value != (xmlChar *)0x0) {
    for (; uVar3 = (ulong)*value, uVar3 < 0x21; value = value + 1) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0) {
          return 0;
        }
        break;
      }
    }
    iVar2 = 0;
    while (-1 < (char)(byte)uVar3) {
      if (((byte)uVar3 < 0x21) && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0)) {
        while ((byte)uVar3 < 0x21) {
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
            if (uVar3 == 0) {
              return iVar2;
            }
            break;
          }
          pbVar1 = value + 1;
          value = value + 1;
          uVar3 = (ulong)*pbVar1;
        }
      }
      else {
        value = value + 1;
      }
      iVar2 = iVar2 + 1;
      uVar3 = (ulong)*value;
      if (*value == 0) {
        return iVar2;
      }
    }
  }
  return -1;
}

Assistant:

static int
xmlSchemaNormLen(const xmlChar *value) {
    const xmlChar *utf;
    int ret = 0;

    if (value == NULL)
	return(-1);
    utf = value;
    while (IS_BLANK_CH(*utf)) utf++;
    while (*utf != 0) {
	if (utf[0] & 0x80) {
	    if ((utf[1] & 0xc0) != 0x80)
		return(-1);
	    if ((utf[0] & 0xe0) == 0xe0) {
		if ((utf[2] & 0xc0) != 0x80)
		    return(-1);
		if ((utf[0] & 0xf0) == 0xf0) {
		    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
			return(-1);
		    utf += 4;
		} else {
		    utf += 3;
		}
	    } else {
		utf += 2;
	    }
	} else if (IS_BLANK_CH(*utf)) {
	    while (IS_BLANK_CH(*utf)) utf++;
	    if (*utf == 0)
		break;
	} else {
	    utf++;
	}
	ret++;
    }
    return(ret);
}